

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize.cpp
# Opt level: O1

void __thiscall
CaDiCaL::Internal::calculate_minimize_chain
          (Internal *this,int lit,vector<int,_std::allocator<int>_> *stack)

{
  Flags FVar1;
  uint uVar2;
  iterator iVar3;
  pointer pFVar4;
  Clause *pCVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  pointer piVar9;
  anon_union_8_2_e79097a7_for_Clause_0 *__args;
  iterator __position;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  pointer pVVar10;
  Clause *pCVar11;
  int idx;
  uint64_t id;
  uint local_54;
  anon_union_8_2_e79097a7_for_Clause_0 local_50;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_48;
  vector<int,std::allocator<int>> *local_40;
  vector<unsigned_long,std::allocator<unsigned_long>> *local_38;
  
  iVar6 = -lit;
  if (0 < lit) {
    iVar6 = lit;
  }
  local_50.id._0_4_ = iVar6;
  iVar3._M_current =
       (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar3._M_current ==
      (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stack,iVar3,(int *)&local_50.id);
  }
  else {
    *iVar3._M_current = iVar6;
    (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = iVar3._M_current + 1;
  }
  piVar9 = (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start != piVar9) {
    local_40 = (vector<int,std::allocator<int>> *)&this->unit_analyzed;
    local_48 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->unit_chain;
    local_38 = (vector<unsigned_long,std::allocator<unsigned_long>> *)&this->mini_chain;
    do {
      local_54 = piVar9[-1];
      lVar8 = (long)(int)local_54;
      (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish = piVar9 + -1;
      if (lVar8 < 0) {
        __position._M_current =
             (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        __args = &((this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                   _M_impl.super__Vector_impl_data._M_start[-local_54].reason)->field_0;
        this_00 = local_38;
        if ((anon_union_8_2_e79097a7_for_Clause_0 *)__position._M_current ==
            (anon_union_8_2_e79097a7_for_Clause_0 *)
            (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
LAB_0083ebac:
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>(this_00,__position,&__args->id);
        }
        else {
          *__position._M_current = (unsigned_long)*__args;
          (this->mini_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               (pointer)((anon_union_8_2_e79097a7_for_Clause_0 *)__position._M_current + 1);
        }
      }
      else {
        pFVar4 = (this->ftab).super__Vector_base<CaDiCaL::Flags,_std::allocator<CaDiCaL::Flags>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        FVar1 = pFVar4[lVar8];
        if (((uint)FVar1 & 0x26) == 0) {
          pVVar10 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start + lVar8;
          if (pVVar10->level == 0) {
            if (((uint)FVar1 & 1) == 0) {
              pFVar4[lVar8] = (Flags)((uint)FVar1 | 1);
              iVar3._M_current =
                   (this->unit_analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (this->unit_analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (local_40,iVar3,(int *)&local_54);
              }
              else {
                *iVar3._M_current = local_54;
                (this->unit_analyzed).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish = iVar3._M_current + 1;
              }
              uVar2 = local_54;
              if ((int)local_54 < 1) {
                uVar2 = -local_54;
              }
              uVar7 = -local_54;
              if ('\0' < this->vals[(int)local_54]) {
                uVar7 = local_54;
              }
              local_50 = (anon_union_8_2_e79097a7_for_Clause_0)
                         ((anon_union_8_2_e79097a7_for_Clause_0 *)
                         ((this->unit_clauses_idx).
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start + (int)(uVar7 >> 0x1f | uVar2 << 1)))->id
              ;
              __position._M_current =
                   (this->unit_chain).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              __args = &local_50;
              this_00 = local_48;
              if ((anon_union_8_2_e79097a7_for_Clause_0 *)__position._M_current ==
                  (anon_union_8_2_e79097a7_for_Clause_0 *)
                  (this->unit_chain).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) goto LAB_0083ebac;
              *__position._M_current = (unsigned_long)local_50;
              (this->unit_chain).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   (pointer)((anon_union_8_2_e79097a7_for_Clause_0 *)__position._M_current + 1);
            }
          }
          else {
            pFVar4[lVar8] = (Flags)((uint)FVar1 | 0x20);
            pCVar5 = pVVar10->reason;
            iVar6 = pCVar5->size;
            local_50.id._0_4_ = -local_54;
            iVar3._M_current =
                 (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar3._M_current ==
                (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (stack,iVar3,(int *)&local_50.id);
            }
            else {
              *iVar3._M_current = -local_54;
              (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
              ._M_finish = iVar3._M_current + 1;
            }
            for (pCVar11 = pVVar10->reason + 1;
                pCVar11 != (Clause *)((long)&pCVar5[1].field_0 + (long)iVar6 * 4);
                pCVar11 = (Clause *)((long)&pCVar11->field_0 + 4)) {
              uVar2 = *(uint *)&pCVar11->field_0;
              if (uVar2 != local_54) {
                uVar7 = -uVar2;
                if (0 < (int)uVar2) {
                  uVar7 = uVar2;
                }
                local_50.id._0_4_ = uVar7;
                iVar3._M_current =
                     (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar3._M_current ==
                    (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            (stack,iVar3,(int *)&local_50.id);
                }
                else {
                  *iVar3._M_current = uVar7;
                  (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
                }
              }
            }
          }
        }
      }
      piVar9 = (stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    } while ((stack->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start != piVar9);
  }
  return;
}

Assistant:

void Internal::calculate_minimize_chain (int lit, std::vector<int> &stack) {
  assert (stack.empty ());
  stack.push_back (vidx (lit));

  while (!stack.empty ()) {
    const int idx = stack.back ();
    assert (idx);
    stack.pop_back ();
    if (idx < 0) {
      Var &v = var (idx);
      mini_chain.push_back (v.reason->id);
      continue;
    }
    assert (idx);
    Flags &f = flags (idx);
    Var &v = var (idx);
    if (f.keep || f.added || f.poison) {
      continue;
    }
    if (!v.level) {
      if (f.seen)
        continue;
      f.seen = true;
      unit_analyzed.push_back (idx);
      const int lit = val (idx) > 0 ? idx : -idx;
      const unsigned uidx = vlit (lit); // I didn't clean added flag
      uint64_t id = unit_clauses (uidx);
      assert (id);
      unit_chain.push_back (id);
      continue;
    }
    f.added = true;
    assert (v.reason && f.removable);
    const const_literal_iterator end = v.reason->end ();
    const_literal_iterator i;
    LOG (v.reason, "LRAT chain for lit %d at depth %zd by going over", lit,
         stack.size ());
    stack.push_back (-idx);
    for (i = v.reason->begin (); i != end; i++) {
      const int other = *i;
      if (other == idx)
        continue;
      stack.push_back (vidx (other));
    }
  }
  assert (stack.empty ());
}